

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemeq.c
# Opt level: O1

uint smemeq(void *av,void *bv,size_t len)

{
  size_t sVar1;
  uint uVar2;
  uchar *b;
  uchar *a;
  
  if (len != 0) {
    sVar1 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 | *(byte *)((long)bv + sVar1) ^ *(byte *)((long)av + sVar1);
      sVar1 = sVar1 + 1;
    } while (len != sVar1);
    return 0x100 - uVar2 >> 8;
  }
  return 1;
}

Assistant:

unsigned smemeq(const void *av, const void *bv, size_t len)
{
    const unsigned char *a = (const unsigned char *)av;
    const unsigned char *b = (const unsigned char *)bv;
    unsigned val = 0;

    while (len-- > 0) {
        val |= *a++ ^ *b++;
    }
    /* Now val is 0 iff we want to return 1, and in the range
     * 0x01..0xFF iff we want to return 0. So subtracting from 0x100
     * will clear bit 8 iff we want to return 0, and leave it set iff
     * we want to return 1, so then we can just shift down. */
    return (0x100 - val) >> 8;
}